

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_authority_key_id(uchar **p,uchar *end,mbedtls_x509_authority *authority_key_id)

{
  int iVar1;
  size_t local_38;
  size_t len;
  mbedtls_x509_authority *pmStack_28;
  int ret;
  mbedtls_x509_authority *authority_key_id_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  local_38 = 0;
  pmStack_28 = authority_key_id;
  authority_key_id_local = (mbedtls_x509_authority *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (len._4_4_ == 0) {
    if ((mbedtls_x509_authority *)(*(long *)end_local + local_38) == authority_key_id_local) {
      len._4_4_ = mbedtls_asn1_get_tag
                            ((uchar **)end_local,(uchar *)authority_key_id_local,&local_38,0x80);
      if (len._4_4_ == 0) {
        (pmStack_28->keyIdentifier).len = local_38;
        (pmStack_28->keyIdentifier).p = *(uchar **)end_local;
        (pmStack_28->keyIdentifier).tag = 4;
        *(size_t *)end_local = local_38 + *(long *)end_local;
      }
      else if (len._4_4_ != -0x62) {
        iVar1 = mbedtls_error_add(-0x2500,len._4_4_,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                  ,0x288);
        return iVar1;
      }
      if (*(mbedtls_x509_authority **)end_local < authority_key_id_local) {
        len._4_4_ = mbedtls_asn1_get_tag
                              ((uchar **)end_local,(uchar *)authority_key_id_local,&local_38,0xa1);
        if (len._4_4_ != 0) {
          iVar1 = mbedtls_error_add(-0x2500,len._4_4_,
                                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                    ,0x292);
          return iVar1;
        }
        len._4_4_ = mbedtls_x509_get_subject_alt_name_ext
                              ((uchar **)end_local,(uchar *)(*(long *)end_local + local_38),
                               &pmStack_28->authorityCertIssuer);
        if (len._4_4_ != 0) {
          return len._4_4_;
        }
        len._4_4_ = mbedtls_asn1_get_tag
                              ((uchar **)end_local,(uchar *)authority_key_id_local,&local_38,0x82);
        if (len._4_4_ != 0) {
          iVar1 = mbedtls_error_add(-0x2500,len._4_4_,
                                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                                    ,0x29f);
          return iVar1;
        }
        (pmStack_28->authorityCertSerialNumber).len = local_38;
        (pmStack_28->authorityCertSerialNumber).p = *(uchar **)end_local;
        (pmStack_28->authorityCertSerialNumber).tag = 2;
        *(size_t *)end_local = local_38 + *(long *)end_local;
      }
      if (*(mbedtls_x509_authority **)end_local == authority_key_id_local) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = -0x2566;
      }
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2500,-0x66,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                             ,0x277);
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,len._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                           ,0x272);
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_authority_key_id(unsigned char **p,
                                     unsigned char *end,
                                     mbedtls_x509_authority *authority_key_id)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0u;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    ret = mbedtls_asn1_get_tag(p, end, &len,
                               MBEDTLS_ASN1_CONTEXT_SPECIFIC);

    /* KeyIdentifier is an OPTIONAL field */
    if (ret == 0) {
        authority_key_id->keyIdentifier.len = len;
        authority_key_id->keyIdentifier.p = *p;
        /* Setting tag of the keyIdentfier intentionally to 0x04.
         * Although the .keyIdentfier field is CONTEXT_SPECIFIC ([0] OPTIONAL),
         * its tag with the content is the payload of on OCTET STRING primitive */
        authority_key_id->keyIdentifier.tag = MBEDTLS_ASN1_OCTET_STRING;

        *p += len;
    } else if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p < end) {
        /* Getting authorityCertIssuer using the required specific class tag [1] */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED |
                                        1)) != 0) {
            /* authorityCertIssuer and authorityCertSerialNumber MUST both
               be present or both be absent. At this point we expect to have both. */
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }
        /* "end" also includes the CertSerialNumber field so "len" shall be used */
        ret = mbedtls_x509_get_subject_alt_name_ext(p,
                                                    (*p+len),
                                                    &authority_key_id->authorityCertIssuer);
        if (ret != 0) {
            return ret;
        }

        /* Getting authorityCertSerialNumber using the required specific class tag [2] */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | 2)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }
        authority_key_id->authorityCertSerialNumber.len = len;
        authority_key_id->authorityCertSerialNumber.p = *p;
        authority_key_id->authorityCertSerialNumber.tag = MBEDTLS_ASN1_INTEGER;
        *p += len;
    }

    if (*p != end) {
        return MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
               MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}